

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panel_code.cpp
# Opt level: O2

int panel_item_width_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Slot_Key AVar4;
  Am_Value fw;
  Am_Object owner;
  
  Am_Object::Get_Owner(&owner,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&owner);
  if (bVar1) {
    fw.type = 0;
    fw.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar3 = Am_Object::Get(&owner,0x99,1);
    Am_Value::operator=(&fw,pAVar3);
    if (fw.type == 2) {
      iVar2 = Am_Value::operator_cast_to_int(&fw);
      if (iVar2 == 1) {
        AVar4 = 0x6e;
        self = &owner;
      }
      else if (iVar2 == 0) {
        AVar4 = 0x1d0;
      }
      else {
        AVar4 = 0x99;
      }
      pAVar3 = Am_Object::Get(self,AVar4,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    }
    else if (fw.type == 4) {
      bVar1 = Am_Value::operator_cast_to_bool(&fw);
      if (bVar1) {
        self = &owner;
      }
      AVar4 = 0x1d0;
      if (bVar1) {
        AVar4 = 0x6e;
      }
      pAVar3 = Am_Object::Get(self,AVar4,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    }
    else {
      iVar2 = 0;
      Am_Error("Am_Panel_Item_Width: wrong type for Am_FIXED_WIDTH slot.",self,0x99);
    }
    Am_Value::~Am_Value(&fw);
  }
  else {
    pAVar3 = Am_Object::Get(self,0x1d0,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  }
  Am_Object::~Am_Object(&owner);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, panel_item_width)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid()) {
    Am_Value fw;
    fw = owner.Peek(Am_FIXED_WIDTH);
    if (fw.type == Am_BOOL) {
      if ((bool)fw)
        return owner.Get(Am_MAX_WIDTH);
      else
        return self.Get(Am_REAL_WIDTH);
    } else // not Am_BOOL
        if (fw.type == Am_INT) {
      int n = fw;
      if (n == 0)
        return self.Get(Am_REAL_WIDTH);
      if (n == 1)
        return owner.Get(Am_MAX_WIDTH);
      return self.Get(Am_FIXED_WIDTH);
    }
    //    else if (!fw.Exists())
    //  return 0;
    else { // neither int nor bool: error.
      Am_Error("Am_Panel_Item_Width: wrong type for Am_FIXED_WIDTH slot.", self,
               Am_FIXED_WIDTH);
      return 0;
    }
  } else
    return self.Get(Am_REAL_WIDTH);
}